

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O1

int proxy_open(proxy_handle *ph)

{
  long *result;
  long *plVar1;
  char **ppcVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  undefined8 *puVar7;
  char *pcVar8;
  regex_handle *prVar9;
  size_t __nmemb;
  long lVar10;
  char *pcVar11;
  ulong uVar12;
  mutex_handle *mutex;
  long lVar13;
  long lVar14;
  
  plVar1 = (long *)ph->priv;
  result = plVar1 + 0x112;
  conn_port_to_str((ph->conf).port,(char *)result);
  __nmemb = (ulong)(ph->conf).bind_addr_ext_add_len + 1;
  *(int *)(plVar1 + 0x107) = (int)__nmemb;
  pvVar6 = calloc(__nmemb,0x48);
  *plVar1 = (long)pvVar6;
  if (pvVar6 == (void *)0x0) {
    return -0xc;
  }
  pvVar6 = calloc(__nmemb,0x50);
  plVar1[0x103] = (long)pvVar6;
  iVar5 = -0xc;
  iVar4 = iVar5;
  if ((pvVar6 == (void *)0x0) || (iVar4 = log_open((log_handle *)(plVar1 + 0x10c)), iVar4 < 0))
  goto LAB_00104be1;
  prVar9 = (regex_handle *)plVar1[0x105];
  if ((ph->conf).calls_allowed == (char *)0x0) {
    if (prVar9 != (regex_handle *)0x0) {
      regex_free(prVar9);
      free((void *)plVar1[0x105]);
      plVar1[0x105] = 0;
    }
LAB_0010477b:
    prVar9 = (regex_handle *)plVar1[0x106];
    if ((ph->conf).calls_denied == (char *)0x0) {
      if (prVar9 != (regex_handle *)0x0) {
        regex_free(prVar9);
        free((void *)plVar1[0x106]);
        plVar1[0x106] = 0;
      }
    }
    else {
      if (prVar9 == (regex_handle *)0x0) {
        prVar9 = (regex_handle *)calloc(1,8);
        plVar1[0x106] = (long)prVar9;
        iVar4 = iVar5;
        if (prVar9 == (regex_handle *)0x0) goto LAB_00104be1;
        iVar4 = regex_init(prVar9);
        if (iVar4 < 0) {
          pcVar11 = "Failed to initialize denied callsigns regex (%d): %s\n";
          goto LAB_001049ff;
        }
      }
      iVar4 = regex_compile((regex_handle *)plVar1[0x106],(ph->conf).calls_denied);
      if (iVar4 < 0) {
        pcVar11 = "Failed to compile denied callsigns regex (%d): %s\n";
        goto LAB_001049ff;
      }
    }
    lVar10 = 0;
    memset(plVar1 + 3,0,0x800);
    lVar14 = *plVar1;
    *(char **)(lVar14 + 0x10) = (ph->conf).bind_addr_ext;
    *(long **)(lVar14 + 0x30) = plVar1 + 1;
    plVar1[1] = lVar14;
    lVar13 = plVar1[0x107];
    if (1 < (long)(int)lVar13) {
      ppcVar2 = (ph->conf).bind_addr_ext_add;
      lVar10 = 0;
      lVar3 = lVar14;
      do {
        *(char **)(lVar3 + 0x58) = ppcVar2[lVar10];
        *(undefined8 *)(lVar3 + 0x80) = 0;
        *(undefined8 *)(lVar3 + 0x88) = 0;
        *(long *)(lVar3 + 0x28) = lVar3 + 0x48;
        *(long *)(lVar3 + 0x78) = lVar3 + 0x28;
        lVar10 = lVar10 + 1;
        lVar3 = lVar3 + 0x48;
      } while ((long)(int)lVar13 + -1 != lVar10);
    }
    puVar7 = (undefined8 *)(lVar14 + lVar10 * 0x48 + 0x28);
    *puVar7 = 0;
    plVar1[2] = (long)puVar7;
    if (0 < (int)plVar1[0x107]) {
      lVar14 = 0;
      uVar12 = 0;
      do {
        lVar13 = *plVar1;
        *(char **)(lVar13 + 0x18 + lVar14) = "5199";
        *(char **)(lVar13 + 0x20 + lVar14) = "5198";
        *(proxy_handle **)(lVar13 + 8 + lVar14) = ph;
        iVar4 = proxy_conn_init((proxy_conn_handle *)(lVar13 + lVar14));
        if (iVar4 < 0) {
          pcVar11 = strerror(-iVar4);
          proxy_log(ph,LOG_LEVEL_FATAL,"Failed to initialize proxy connection #%d (%d): %s\n",
                    uVar12 & 0xffffffff,(ulong)(uint)-iVar4,pcVar11);
          if (uVar12 != 0) {
            lVar14 = uVar12 + 1;
            do {
              proxy_conn_free((proxy_conn_handle *)((ulong)((int)lVar14 - 2) * 0x48 + *plVar1));
              lVar14 = lVar14 + -1;
            } while (1 < lVar14);
          }
          goto LAB_00104be1;
        }
        uVar12 = uVar12 + 1;
        lVar14 = lVar14 + 0x48;
      } while ((long)uVar12 < (long)(int)plVar1[0x107]);
    }
    if (0 < (int)plVar1[0x107]) {
      lVar14 = 0;
      uVar12 = 0;
      do {
        lVar13 = plVar1[0x103];
        mutex = (mutex_handle *)((undefined8 *)(lVar14 + lVar13) + 3);
        *(undefined8 *)(lVar14 + lVar13) = ph;
        iVar4 = mutex_init(mutex);
        if (-1 < iVar4) {
          lVar10 = lVar14 + lVar13;
          *(long *)(lVar10 + 0x30) = lVar13 + lVar14;
          *(code **)(lVar10 + 0x28) = proxy_worker_func;
          *(undefined4 *)(lVar10 + 0x38) = 0x100000;
          iVar5 = worker_init((worker_handle *)(lVar10 + 0x20));
          iVar4 = 0;
          if (iVar5 < 0) {
            mutex_free(mutex);
            iVar4 = iVar5;
          }
        }
        if (iVar4 < 0) {
          pcVar11 = strerror(-iVar4);
          proxy_log(ph,LOG_LEVEL_FATAL,"Failed to initialize proxy client worker #%d (%d): %s\n",
                    uVar12 & 0xffffffff,(ulong)(uint)-iVar4,pcVar11);
          if (lVar14 != 0) {
            lVar14 = uVar12 + 1;
            do {
              lVar13 = plVar1[0x103];
              lVar10 = (ulong)((int)lVar14 - 2) * 0x50;
              worker_free((worker_handle *)(lVar13 + lVar10 + 0x20));
              mutex_free((mutex_handle *)(lVar13 + lVar10 + 0x18));
              lVar14 = lVar14 + -1;
            } while (1 < lVar14);
          }
          goto LAB_00104bac;
        }
        lVar13 = plVar1[0x103];
        *(long *)(lVar13 + 0x10 + lVar14) = plVar1[0x104];
        plVar1[0x104] = lVar13 + lVar14;
        uVar12 = uVar12 + 1;
        lVar14 = lVar14 + 0x50;
      } while ((long)uVar12 < (long)(int)plVar1[0x107]);
    }
    plVar1[0x109] = (long)(ph->conf).bind_addr;
    plVar1[0x10a] = (long)result;
    iVar4 = conn_listen((conn_handle *)(plVar1 + 0x108));
    if (-1 < iVar4) {
      pcVar11 = (ph->conf).bind_addr;
      if (pcVar11 != (char *)0x0) {
        proxy_log(ph,LOG_LEVEL_INFO,"Listening for connections at %s:%s\n",pcVar11,result);
        return 0;
      }
      proxy_log(ph,LOG_LEVEL_INFO,"Listening for connections on port %s\n",result);
      return 0;
    }
    pcVar11 = strerror(-iVar4);
    proxy_log(ph,LOG_LEVEL_FATAL,"Failed to open listening port (%d): %s\n",(ulong)(uint)-iVar4,
              pcVar11);
    plVar1[0x104] = 0;
    if (0 < (int)plVar1[0x107]) {
      lVar14 = 0x18;
      lVar13 = 0;
      do {
        lVar10 = plVar1[0x103];
        worker_free((worker_handle *)(lVar10 + lVar14 + 8));
        mutex_free((mutex_handle *)(lVar10 + lVar14));
        lVar13 = lVar13 + 1;
        lVar14 = lVar14 + 0x50;
      } while (lVar13 < (int)plVar1[0x107]);
    }
LAB_00104bac:
    plVar1[1] = 0;
    plVar1[2] = 0;
    if (0 < (int)plVar1[0x107]) {
      lVar13 = 0;
      lVar14 = 0;
      do {
        proxy_conn_free((proxy_conn_handle *)(*plVar1 + lVar13));
        lVar14 = lVar14 + 1;
        lVar13 = lVar13 + 0x48;
      } while (lVar14 < (int)plVar1[0x107]);
    }
  }
  else {
    if (prVar9 == (regex_handle *)0x0) {
      prVar9 = (regex_handle *)calloc(1,8);
      plVar1[0x105] = (long)prVar9;
      iVar4 = iVar5;
      if (prVar9 == (regex_handle *)0x0) goto LAB_00104be1;
      iVar4 = regex_init(prVar9);
      if (-1 < iVar4) goto LAB_00104729;
      pcVar11 = "Failed to initialize allowed callsigns regex (%d): %s\n";
    }
    else {
LAB_00104729:
      iVar4 = regex_compile((regex_handle *)plVar1[0x105],(ph->conf).calls_allowed);
      if (-1 < iVar4) goto LAB_0010477b;
      pcVar11 = "Failed to compile allowed callsigns regex (%d): %s\n";
    }
LAB_001049ff:
    pcVar8 = strerror(-iVar4);
    proxy_log(ph,LOG_LEVEL_FATAL,pcVar11,(ulong)(uint)-iVar4,pcVar8);
  }
LAB_00104be1:
  if ((regex_handle *)plVar1[0x105] != (regex_handle *)0x0) {
    regex_free((regex_handle *)plVar1[0x105]);
    free((void *)plVar1[0x105]);
    plVar1[0x105] = 0;
  }
  log_close((log_handle *)(plVar1 + 0x10c));
  free((void *)plVar1[0x103]);
  plVar1[0x103] = 0;
  free((void *)*plVar1);
  *plVar1 = 0;
  *(undefined4 *)(plVar1 + 0x107) = 0;
  return iVar4;
}

Assistant:

int proxy_open(struct proxy_handle *ph)
{
	struct proxy_priv *priv = ph->priv;
	int i;
	int ret;

	conn_port_to_str(ph->conf.port, priv->port_str);

	priv->num_clients = 1 + ph->conf.bind_addr_ext_add_len;

	priv->clients = calloc(priv->num_clients, sizeof(*priv->clients));
	if (priv->clients == NULL)
		return -ENOMEM;

	priv->client_workers = calloc(priv->num_clients,
				      sizeof(struct proxy_worker));
	if (priv->client_workers == NULL) {
		ret = -ENOMEM;
		goto proxy_open_exit;
	}

	ret = log_open(&priv->log);
	if (ret < 0)
		goto proxy_open_exit;

	if (ph->conf.calls_allowed != NULL) {
		if (priv->re_calls_allowed == NULL) {
			priv->re_calls_allowed = calloc(1,
				sizeof(*priv->re_calls_allowed));
			if (priv->re_calls_allowed == NULL) {
				ret = -ENOMEM;
				goto proxy_open_exit;
			}

			ret = regex_init(priv->re_calls_allowed);
			if (ret < 0) {
				proxy_log(ph, LOG_LEVEL_FATAL,
					  "Failed to initialize allowed callsigns regex (%d): %s\n",
					  -ret, strerror(-ret));
				goto proxy_open_exit;
			}
		}

		ret = regex_compile(priv->re_calls_allowed,
				    ph->conf.calls_allowed);
		if (ret < 0) {
			proxy_log(ph, LOG_LEVEL_FATAL,
				  "Failed to compile allowed callsigns regex (%d): %s\n",
				  -ret, strerror(-ret));
			goto proxy_open_exit;
		}
	} else if (priv->re_calls_allowed != NULL) {
		regex_free(priv->re_calls_allowed);
		free(priv->re_calls_allowed);
		priv->re_calls_allowed = NULL;
	}

	if (ph->conf.calls_denied != NULL) {
		if (priv->re_calls_denied == NULL) {
			priv->re_calls_denied = calloc(1,
				sizeof(*priv->re_calls_denied));
			if (priv->re_calls_denied == NULL) {
				ret = -ENOMEM;
				goto proxy_open_exit;
			}

			ret = regex_init(priv->re_calls_denied);
			if (ret < 0) {
				proxy_log(ph, LOG_LEVEL_FATAL,
					  "Failed to initialize denied callsigns regex (%d): %s\n",
					  -ret, strerror(-ret));
				goto proxy_open_exit;
			}
		}

		ret = regex_compile(priv->re_calls_denied,
				    ph->conf.calls_denied);
		if (ret < 0) {
			proxy_log(ph, LOG_LEVEL_FATAL,
				  "Failed to compile denied callsigns regex (%d): %s\n",
				  -ret, strerror(-ret));
			goto proxy_open_exit;
		}
	} else if (priv->re_calls_denied != NULL) {
		regex_free(priv->re_calls_denied);
		free(priv->re_calls_denied);
		priv->re_calls_denied = NULL;
	}

	memset(priv->clients_by_call, 0x0, sizeof(priv->clients_by_call));

	priv->clients[0].source_addr = ph->conf.bind_addr_ext;

	priv->clients[0].prev_ptr = &priv->idle_clients_head;
	priv->idle_clients_head = &priv->clients[0];

	for (i = 1; i < priv->num_clients; i++) {
		priv->clients[i].source_addr = ph->conf.bind_addr_ext_add[i - 1];
		priv->clients[i].prev_by_call_ptr = NULL;
		priv->clients[i].next_by_call = NULL;
		priv->clients[i - 1].next = &priv->clients[i];
		priv->clients[i].prev_ptr = &priv->clients[i - 1].next;
	}

	priv->clients[i - 1].next = NULL;
	priv->idle_clients_tail_ptr = &priv->clients[i - 1].next;

	for (i = 0; i < priv->num_clients; i++) {
		priv->clients[i].control_port = "5199";
		priv->clients[i].data_port = "5198";
		priv->clients[i].ph = ph;
		ret = proxy_conn_init(&priv->clients[i]);
		if (ret < 0) {
			proxy_log(ph, LOG_LEVEL_FATAL,
				  "Failed to initialize proxy connection #%d (%d): %s\n",
				  i, -ret, strerror(-ret));

			for (i--; i >= 0; i--)
				proxy_conn_free(&priv->clients[i]);

			goto proxy_open_exit;
		}
	}

	for (i = 0; i < priv->num_clients; i++) {
		priv->client_workers[i].ph = ph;
		ret = proxy_worker_init(&priv->client_workers[i]);
		if (ret < 0) {
			proxy_log(ph, LOG_LEVEL_FATAL,
				  "Failed to initialize proxy client worker #%d (%d): %s\n",
				  i, -ret, strerror(-ret));

			for (i--; i >= 0; i--)
				proxy_worker_free(&priv->client_workers[i]);

			goto proxy_open_exit_late;
		}

		priv->client_workers[i].next = priv->idle_workers_head;
		priv->idle_workers_head = &priv->client_workers[i];
	}

	priv->conn_listen.source_addr = (const char *)ph->conf.bind_addr;
	priv->conn_listen.source_port = (const char *)priv->port_str;

	ret = conn_listen(&priv->conn_listen);
	if (ret < 0) {
		proxy_log(ph, LOG_LEVEL_FATAL,
			  "Failed to open listening port (%d): %s\n",
			  -ret, strerror(-ret));
		goto proxy_open_exit_later;
	}

	if (ph->conf.bind_addr == NULL)
		proxy_log(ph, LOG_LEVEL_INFO,
			  "Listening for connections on port %s\n",
			  priv->port_str);
	else
		proxy_log(ph, LOG_LEVEL_INFO,
			  "Listening for connections at %s:%s\n",
			  ph->conf.bind_addr,
			  priv->port_str);

	return 0;

proxy_open_exit_later:
	priv->idle_workers_head = NULL;
	for (i = 0; i < priv->num_clients; i++)
		proxy_worker_free(&priv->client_workers[i]);

proxy_open_exit_late:
	priv->idle_clients_head = NULL;
	priv->idle_clients_tail_ptr = NULL;
	for (i = 0; i < priv->num_clients; i++)
		proxy_conn_free(&priv->clients[i]);

proxy_open_exit:
	if (priv->re_calls_allowed != NULL) {
		regex_free(priv->re_calls_allowed);
		free(priv->re_calls_allowed);
		priv->re_calls_allowed = NULL;
	}

	log_close(&priv->log);

	free(priv->client_workers);
	priv->client_workers = NULL;

	free(priv->clients);
	priv->clients = NULL;

	priv->num_clients = 0;

	return ret;
}